

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O0

basic_ostream<wchar_t,_std::char_traits<wchar_t>_> * __thiscall
pstore::dump::object::write_full_size<std::wostream,pstore::dump::object_wchar_traits>
          (object *this,basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *os,indent *ind,
          object_strings<pstore::dump::object_wchar_traits> *strings)

{
  wchar_t wVar1;
  _Tuple_impl<0UL,_std::shared_ptr<pstore::dump::value>,_std::shared_ptr<pstore::dump::value>,_unsigned_long>
  *p_Var2;
  ulong uVar3;
  container *pcVar4;
  bool bVar5;
  size_type __n;
  unsigned_long *puVar6;
  __tuple_element_t<2UL,_tuple<shared_ptr<value>,_shared_ptr<value>,_unsigned_long>_> *p_Var7;
  wostream *pwVar8;
  __shared_ptr_access<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00;
  element_type *peVar9;
  basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *pbVar10;
  wchar_t *pwVar11;
  __tuple_element_t<1UL,_tuple<shared_ptr<value>,_shared_ptr<value>,_unsigned_long>_> *p_Var12;
  indent local_168 [8];
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_148 [32];
  shared_ptr<pstore::dump::value> local_128;
  undefined1 local_118 [8];
  __tuple_element_t<1UL,_tuple<shared_ptr<value>,_shared_ptr<value>,_unsigned_long>_> value;
  wstring local_100 [32];
  ulong local_e0;
  size_t num_spaces;
  tuple<std::shared_ptr<pstore::dump::value>,_std::shared_ptr<pstore::dump::value>,_unsigned_long>
  *a;
  iterator __end2_1;
  iterator __begin2_1;
  vector<std::tuple<std::shared_ptr<pstore::dump::value>,_std::shared_ptr<pstore::dump::value>,_unsigned_long>,_std::allocator<std::tuple<std::shared_ptr<pstore::dump::value>,_std::shared_ptr<pstore::dump::value>,_unsigned_long>_>_>
  *__range2_1;
  wstring local_b0 [3];
  anon_class_1_0_00000001 needs_new_line;
  indent next_indent;
  string_type sep;
  undefined1 local_90 [24];
  size_t key_length;
  member *kvp;
  const_iterator __end2;
  const_iterator __begin2;
  container *__range2;
  size_t longest;
  undefined1 local_40 [8];
  vector<std::tuple<std::shared_ptr<pstore::dump::value>,_std::shared_ptr<pstore::dump::value>,_unsigned_long>,_std::allocator<std::tuple<std::shared_ptr<pstore::dump::value>,_std::shared_ptr<pstore::dump::value>,_unsigned_long>_>_>
  kvps;
  object_strings<pstore::dump::object_wchar_traits> *strings_local;
  indent *ind_local;
  basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *os_local;
  object *this_local;
  
  kvps.
  super__Vector_base<std::tuple<std::shared_ptr<pstore::dump::value>,_std::shared_ptr<pstore::dump::value>,_unsigned_long>,_std::allocator<std::tuple<std::shared_ptr<pstore::dump::value>,_std::shared_ptr<pstore::dump::value>,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)strings;
  std::
  vector<std::tuple<std::shared_ptr<pstore::dump::value>,_std::shared_ptr<pstore::dump::value>,_unsigned_long>,_std::allocator<std::tuple<std::shared_ptr<pstore::dump::value>,_std::shared_ptr<pstore::dump::value>,_unsigned_long>_>_>
  ::vector((vector<std::tuple<std::shared_ptr<pstore::dump::value>,_std::shared_ptr<pstore::dump::value>,_unsigned_long>,_std::allocator<std::tuple<std::shared_ptr<pstore::dump::value>,_std::shared_ptr<pstore::dump::value>,_unsigned_long>_>_>
            *)local_40);
  __n = std::vector<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>::
        size(&this->members_);
  std::
  vector<std::tuple<std::shared_ptr<pstore::dump::value>,_std::shared_ptr<pstore::dump::value>,_unsigned_long>,_std::allocator<std::tuple<std::shared_ptr<pstore::dump::value>,_std::shared_ptr<pstore::dump::value>,_unsigned_long>_>_>
  ::reserve((vector<std::tuple<std::shared_ptr<pstore::dump::value>,_std::shared_ptr<pstore::dump::value>,_unsigned_long>,_std::allocator<std::tuple<std::shared_ptr<pstore::dump::value>,_std::shared_ptr<pstore::dump::value>,_unsigned_long>_>_>
             *)local_40,__n);
  __range2 = (container *)0x0;
  __end2 = std::vector<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>
           ::begin(&this->members_);
  kvp = (member *)
        std::vector<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>::
        end(&this->members_);
  while (bVar5 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<const_pstore::dump::object::member_*,_std::vector<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>_>
                                     *)&kvp), bVar5) {
    key_length = (size_t)__gnu_cxx::
                         __normal_iterator<const_pstore::dump::object::member_*,_std::vector<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>_>
                         ::operator*(&__end2);
    local_90._16_8_ = property_length<wchar_t>((string *)key_length);
    puVar6 = std::max<unsigned_long>((unsigned_long *)&__range2,(unsigned_long *)(local_90 + 0x10));
    __range2 = (container *)*puVar6;
    property((object *)local_90,(string *)key_length);
    std::
    vector<std::tuple<std::shared_ptr<pstore::dump::value>,std::shared_ptr<pstore::dump::value>,unsigned_long>,std::allocator<std::tuple<std::shared_ptr<pstore::dump::value>,std::shared_ptr<pstore::dump::value>,unsigned_long>>>
    ::
    emplace_back<std::shared_ptr<pstore::dump::string>,std::shared_ptr<pstore::dump::value>const&,unsigned_long_const&>
              ((vector<std::tuple<std::shared_ptr<pstore::dump::value>,std::shared_ptr<pstore::dump::value>,unsigned_long>,std::allocator<std::tuple<std::shared_ptr<pstore::dump::value>,std::shared_ptr<pstore::dump::value>,unsigned_long>>>
                *)local_40,(shared_ptr<pstore::dump::string> *)local_90,
               (shared_ptr<pstore::dump::value> *)(key_length + 0x20),
               (unsigned_long *)(local_90 + 0x10));
    std::shared_ptr<pstore::dump::string>::~shared_ptr((shared_ptr<pstore::dump::string> *)local_90)
    ;
    __gnu_cxx::
    __normal_iterator<const_pstore::dump::object::member_*,_std::vector<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>_>
    ::operator++(&__end2);
  }
  std::__cxx11::wstring::wstring(local_b0);
  __range2_1._4_4_ = indent::next(ind,4);
  __end2_1 = std::
             vector<std::tuple<std::shared_ptr<pstore::dump::value>,_std::shared_ptr<pstore::dump::value>,_unsigned_long>,_std::allocator<std::tuple<std::shared_ptr<pstore::dump::value>,_std::shared_ptr<pstore::dump::value>,_unsigned_long>_>_>
             ::begin((vector<std::tuple<std::shared_ptr<pstore::dump::value>,_std::shared_ptr<pstore::dump::value>,_unsigned_long>,_std::allocator<std::tuple<std::shared_ptr<pstore::dump::value>,_std::shared_ptr<pstore::dump::value>,_unsigned_long>_>_>
                      *)local_40);
  a = (tuple<std::shared_ptr<pstore::dump::value>,_std::shared_ptr<pstore::dump::value>,_unsigned_long>
       *)std::
         vector<std::tuple<std::shared_ptr<pstore::dump::value>,_std::shared_ptr<pstore::dump::value>,_unsigned_long>,_std::allocator<std::tuple<std::shared_ptr<pstore::dump::value>,_std::shared_ptr<pstore::dump::value>,_unsigned_long>_>_>
         ::end((vector<std::tuple<std::shared_ptr<pstore::dump::value>,_std::shared_ptr<pstore::dump::value>,_unsigned_long>,_std::allocator<std::tuple<std::shared_ptr<pstore::dump::value>,_std::shared_ptr<pstore::dump::value>,_unsigned_long>_>_>
                *)local_40);
  while (bVar5 = __gnu_cxx::operator!=
                           (&__end2_1,
                            (__normal_iterator<std::tuple<std::shared_ptr<pstore::dump::value>,_std::shared_ptr<pstore::dump::value>,_unsigned_long>_*,_std::vector<std::tuple<std::shared_ptr<pstore::dump::value>,_std::shared_ptr<pstore::dump::value>,_unsigned_long>,_std::allocator<std::tuple<std::shared_ptr<pstore::dump::value>,_std::shared_ptr<pstore::dump::value>,_unsigned_long>_>_>_>
                             *)&a), bVar5) {
    num_spaces = (size_t)__gnu_cxx::
                         __normal_iterator<std::tuple<std::shared_ptr<pstore::dump::value>,_std::shared_ptr<pstore::dump::value>,_unsigned_long>_*,_std::vector<std::tuple<std::shared_ptr<pstore::dump::value>,_std::shared_ptr<pstore::dump::value>,_unsigned_long>,_std::allocator<std::tuple<std::shared_ptr<pstore::dump::value>,_std::shared_ptr<pstore::dump::value>,_unsigned_long>_>_>_>
                         ::operator*(&__end2_1);
    pcVar4 = __range2;
    p_Var7 = std::
             get<2ul,std::shared_ptr<pstore::dump::value>,std::shared_ptr<pstore::dump::value>,unsigned_long>
                       ((tuple<std::shared_ptr<pstore::dump::value>,_std::shared_ptr<pstore::dump::value>,_unsigned_long>
                         *)num_spaces);
    local_e0 = (long)pcVar4 + (1 - *p_Var7);
    pwVar8 = std::operator<<(os,local_b0);
    this_00 = (__shared_ptr_access<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
              std::
              get<0ul,std::shared_ptr<pstore::dump::value>,std::shared_ptr<pstore::dump::value>,unsigned_long>
                        ((tuple<std::shared_ptr<pstore::dump::value>,_std::shared_ptr<pstore::dump::value>,_unsigned_long>
                          *)num_spaces);
    peVar9 = std::__shared_ptr_access<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator*(this_00);
    pbVar10 = dump::operator<<(pwVar8,peVar9);
    uVar3 = local_e0;
    pwVar11 = (wchar_t *)
              std::__cxx11::wstring::operator[]
                        ((ulong)kvps.
                                super__Vector_base<std::tuple<std::shared_ptr<pstore::dump::value>,_std::shared_ptr<pstore::dump::value>,_unsigned_long>,_std::allocator<std::tuple<std::shared_ptr<pstore::dump::value>,_std::shared_ptr<pstore::dump::value>,_unsigned_long>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    wVar1 = *pwVar11;
    std::allocator<wchar_t>::allocator();
    std::__cxx11::wstring::wstring
              (local_100,uVar3,wVar1,
               (allocator *)
               ((long)&value.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi + 7));
    pwVar8 = std::operator<<(pbVar10,local_100);
    std::operator<<(pwVar8,(wstring *)
                           &kvps.
                            super__Vector_base<std::tuple<std::shared_ptr<pstore::dump::value>,_std::shared_ptr<pstore::dump::value>,_unsigned_long>,_std::allocator<std::tuple<std::shared_ptr<pstore::dump::value>,_std::shared_ptr<pstore::dump::value>,_unsigned_long>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage[1].
                            super__Tuple_impl<0UL,_std::shared_ptr<pstore::dump::value>,_std::shared_ptr<pstore::dump::value>,_unsigned_long>
                            .super__Head_base<0UL,_std::shared_ptr<pstore::dump::value>,_false>);
    std::__cxx11::wstring::~wstring(local_100);
    std::allocator<wchar_t>::~allocator
              ((allocator<wchar_t> *)
               ((long)&value.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi + 7));
    p_Var12 = std::
              get<1ul,std::shared_ptr<pstore::dump::value>,std::shared_ptr<pstore::dump::value>,unsigned_long>
                        ((tuple<std::shared_ptr<pstore::dump::value>,_std::shared_ptr<pstore::dump::value>,_unsigned_long>
                          *)num_spaces);
    std::shared_ptr<pstore::dump::value>::shared_ptr
              ((shared_ptr<pstore::dump::value> *)local_118,p_Var12);
    std::shared_ptr<pstore::dump::value>::shared_ptr
              (&local_128,(shared_ptr<pstore::dump::value> *)local_118);
    bVar5 = write_full_size<std::basic_ostream<wchar_t,_std::char_traits<wchar_t>_>,_pstore::dump::object_wchar_traits>
            ::anon_class_1_0_00000001::operator()
                      ((anon_class_1_0_00000001 *)((long)&__range2_1 + 3),&local_128);
    std::shared_ptr<pstore::dump::value>::~shared_ptr(&local_128);
    if (bVar5) {
      pwVar8 = std::operator<<(os,(wstring *)
                                  &((kvps.
                                     super__Vector_base<std::tuple<std::shared_ptr<pstore::dump::value>,_std::shared_ptr<pstore::dump::value>,_unsigned_long>,_std::allocator<std::tuple<std::shared_ptr<pstore::dump::value>,_std::shared_ptr<pstore::dump::value>,_unsigned_long>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                   super__Tuple_impl<0UL,_std::shared_ptr<pstore::dump::value>,_std::shared_ptr<pstore::dump::value>,_unsigned_long>
                                   ).
                                   super__Head_base<0UL,_std::shared_ptr<pstore::dump::value>,_false>
                                   ._M_head_impl.
                                   super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_refcount);
      dump::operator<<(pwVar8,(indent *)((long)&__range2_1 + 4));
    }
    peVar9 = std::__shared_ptr_access<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_118);
    (*peVar9->_vptr_value[0x16])(peVar9,os,(long)&__range2_1 + 4);
    p_Var2 = &(kvps.
               super__Vector_base<std::tuple<std::shared_ptr<pstore::dump::value>,_std::shared_ptr<pstore::dump::value>,_unsigned_long>,_std::allocator<std::tuple<std::shared_ptr<pstore::dump::value>,_std::shared_ptr<pstore::dump::value>,_unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage)->
              super__Tuple_impl<0UL,_std::shared_ptr<pstore::dump::value>,_std::shared_ptr<pstore::dump::value>,_unsigned_long>
    ;
    indent::str<wchar_t>(local_168);
    std::operator+(local_148,
                   (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
                   &(p_Var2->super__Head_base<0UL,_std::shared_ptr<pstore::dump::value>,_false>).
                    _M_head_impl.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount);
    std::__cxx11::wstring::operator=(local_b0,(wstring *)local_148);
    std::__cxx11::wstring::~wstring((wstring *)local_148);
    std::__cxx11::wstring::~wstring((wstring *)local_168);
    std::shared_ptr<pstore::dump::value>::~shared_ptr((shared_ptr<pstore::dump::value> *)local_118);
    __gnu_cxx::
    __normal_iterator<std::tuple<std::shared_ptr<pstore::dump::value>,_std::shared_ptr<pstore::dump::value>,_unsigned_long>_*,_std::vector<std::tuple<std::shared_ptr<pstore::dump::value>,_std::shared_ptr<pstore::dump::value>,_unsigned_long>,_std::allocator<std::tuple<std::shared_ptr<pstore::dump::value>,_std::shared_ptr<pstore::dump::value>,_unsigned_long>_>_>_>
    ::operator++(&__end2_1);
  }
  std::__cxx11::wstring::~wstring(local_b0);
  std::
  vector<std::tuple<std::shared_ptr<pstore::dump::value>,_std::shared_ptr<pstore::dump::value>,_unsigned_long>,_std::allocator<std::tuple<std::shared_ptr<pstore::dump::value>,_std::shared_ptr<pstore::dump::value>,_unsigned_long>_>_>
  ::~vector((vector<std::tuple<std::shared_ptr<pstore::dump::value>,_std::shared_ptr<pstore::dump::value>,_unsigned_long>,_std::allocator<std::tuple<std::shared_ptr<pstore::dump::value>,_std::shared_ptr<pstore::dump::value>,_unsigned_long>_>_>
             *)local_40);
  return os;
}

Assistant:

OStream &
        object::write_full_size (OStream & os, indent const & ind,
                                 object_strings<ObjectCharacterTraits> const & strings) const {
            using char_type = typename OStream::char_type;
            using string_type = std::basic_string<char_type>;

            // Proceed in two phases: the first measures the length of all of the object keys to
            // find the longest. This enables the values to be nicely aligned by inserting the
            // correct horizontal spacing.
            enum { key_index, value_index, key_length_index };
            std::vector<std::tuple<value_ptr, value_ptr, std::size_t>> kvps;
            kvps.reserve (members_.size ());

            auto longest = std::size_t{0};
            for (object::member const & kvp : members_) {
                std::size_t const key_length = object::property_length<char_type> (kvp.property);
                longest = std::max (longest, key_length);
                kvps.emplace_back (object::property (kvp.property), kvp.val, key_length);
            }

            // The second phase: produce the keys and values with the correct number of spaces
            // between them.
            string_type sep;
            indent next_indent = ind.next (4);

            auto const needs_new_line = [] (value_ptr const value) {
                object const * const obj = value->dynamic_cast_object ();
                return obj != nullptr && !obj->is_compact ();
            };

            for (auto const & a : kvps) {
                std::size_t const num_spaces = longest - std::get<key_length_index> (a) + 1U;
                os << sep << (*std::get<key_index> (a))
                   << string_type (num_spaces, strings.space_str[0]) << strings.colon_space_str;

                // If the value is an object then we may need to insert a new line here.
                auto const value = std::get<value_index> (a);
                if (needs_new_line (value)) {
                    os << strings.cr_str << next_indent;
                }
                value->write_impl (os, next_indent);

                sep = strings.cr_str + ind.str<char_type> ();
            }
            return os;
        }